

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scene.cpp
# Opt level: O1

Color * __thiscall
Scene::trace(Color *__return_storage_ptr__,Scene *this,Medium *curMed,double weight,Ray *ray)

{
  element_type *peVar1;
  int iVar2;
  undefined4 extraout_var;
  double t;
  Color local_70;
  Vector local_58;
  Vector local_40;
  
  level = level + 1;
  Stats::totalRays = Stats::totalRays + 1;
  iVar2 = (*this->_vptr_Scene[2])(this,ray);
  if ((GeometricObject *)CONCAT44(extraout_var,iVar2) == (GeometricObject *)0x0) {
    (*this->_vptr_Scene[3])(&local_70,this,ray);
    __return_storage_ptr__->x = local_70.x;
    __return_storage_ptr__->y = local_70.y;
  }
  else {
    local_58.x = (ray->dir).x;
    local_40.x = local_58.x * 30000.0 + (ray->org).x;
    local_40.y = (ray->dir).y * 30000.0 + (ray->org).y;
    local_40.z = (ray->dir).z * 30000.0 + (ray->org).z;
    local_58.y = (ray->dir).y;
    local_58.z = (ray->dir).z;
    shade(&local_70,this,curMed,weight,&local_40,&local_58,
          (GeometricObject *)CONCAT44(extraout_var,iVar2));
    __return_storage_ptr__->x = local_70.x;
    __return_storage_ptr__->y = local_70.y;
    __return_storage_ptr__->z = local_70.z;
    if (curMed->beta <= threshold) goto LAB_00104a8f;
    local_70.z = exp(curMed->beta * -30000.0);
    __return_storage_ptr__->x = __return_storage_ptr__->x * local_70.z;
    __return_storage_ptr__->y = __return_storage_ptr__->y * local_70.z;
    local_70.z = local_70.z * __return_storage_ptr__->z;
  }
  __return_storage_ptr__->z = local_70.z;
LAB_00104a8f:
  peVar1 = (this->envFog).super___shared_ptr<Fog,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (peVar1 != (element_type *)0x0) {
    (*(code *)**(undefined8 **)peVar1)(0x40dd4c0000000000,peVar1,__return_storage_ptr__);
  }
  level = level + -1;
  return __return_storage_ptr__;
}

Assistant:

Color Scene::trace(Grayzer::Medium& curMed, double weight, Ray& ray)
{
   GeometricObject *obj;
   double t = GEOM_INFINITY;
   Color color;

   level++;
   Stats::raysCast();

   if((obj = intersect(ray,t)) != 0)
   {
      color = shade(curMed, weight, ray.point(t), ray.dir, obj);
      if(curMed.beta > threshold) color *= exp(-t * curMed.beta);
   }
   else
      color = shade_background(ray);
   //
   // added fog
   //
   if (envFog) envFog->shade(color, t);

   level--;
   return color;
}